

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdswitch.c
# Opt level: O3

boolean read_scan_integer(FILE *file,long *result,int *termchar)

{
  boolean bVar1;
  int iVar2;
  int iVar3;
  ushort **ppuVar4;
  bool bVar5;
  
  bVar1 = read_text_integer(file,result,termchar);
  if (bVar1 == 0) {
LAB_00108f7e:
    bVar1 = 0;
  }
  else {
    iVar2 = *termchar;
    ppuVar4 = __ctype_b_loc();
    if (iVar2 == -1) {
      bVar5 = false;
      iVar3 = -1;
    }
    else {
      do {
        bVar5 = (*(byte *)((long)*ppuVar4 + (long)iVar2 * 2 + 1) & 0x20) == 0;
        iVar3 = iVar2;
        if (bVar5) break;
        iVar2 = text_getc(file);
        iVar3 = -1;
      } while (iVar2 != -1);
    }
    if ((*(byte *)((long)*ppuVar4 + (long)iVar3 * 2 + 1) & 8) == 0) {
      iVar2 = 0x20;
      if (0xfffffffd < iVar3 - 0x3cU) {
        iVar2 = iVar3;
      }
      if (!bVar5) {
        iVar2 = iVar3;
      }
    }
    else {
      iVar3 = ungetc(iVar3,(FILE *)file);
      iVar2 = 0x20;
      if (iVar3 == -1) goto LAB_00108f7e;
    }
    *termchar = iVar2;
    bVar1 = 1;
  }
  return bVar1;
}

Assistant:

LOCAL(boolean)
read_scan_integer(FILE *file, long *result, int *termchar)
/* Variant of read_text_integer that always looks for a non-space termchar;
 * this simplifies parsing of punctuation in scan scripts.
 */
{
  register int ch;

  if (!read_text_integer(file, result, termchar))
    return FALSE;
  ch = *termchar;
  while (ch != EOF && isspace(ch))
    ch = text_getc(file);
  if (isdigit(ch)) {            /* oops, put it back */
    if (ungetc(ch, file) == EOF)
      return FALSE;
    ch = ' ';
  } else {
    /* Any separators other than ';' and ':' are ignored;
     * this allows user to insert commas, etc, if desired.
     */
    if (ch != EOF && ch != ';' && ch != ':')
      ch = ' ';
  }
  *termchar = ch;
  return TRUE;
}